

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqComms.cpp
# Opt level: O3

void __thiscall helics::zeromq::ZmqComms::queue_rx_function(ZmqComms *this)

{
  timespec *__requested_time;
  size_type sVar1;
  ConnectionStatus CVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  ulong uVar8;
  void *data;
  size_t size;
  int *piVar9;
  error_t *peVar10;
  socklen_t sVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  size_t __n;
  socket_base sVar14;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *extraout_RDX_02;
  sockaddr *__addr;
  sockaddr *__addr_00;
  long lVar15;
  ConnectionStatus status;
  ActionMessage *pAVar16;
  string *psVar17;
  context_t *pcVar18;
  timespec *ptVar19;
  pointer pcVar20;
  string *psVar21;
  void *in_R8;
  void *pvVar22;
  undefined8 uVar23;
  undefined8 in_R9;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string str;
  message_t msg;
  socket_t repSocket;
  socket_t brokerReqTerm;
  socket_t pullSocket;
  ActionMessage M;
  socket_t controlSocket;
  shared_ptr<ZmqContextManager> ctx;
  string controlsockString;
  pollitem_t poller;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  socket_t local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string *local_180;
  socket_t local_178;
  socket_t local_168;
  undefined1 local_158 [64];
  SmallBuffer local_118;
  socket_t local_a0;
  undefined1 local_90 [48];
  context_t local_60;
  undefined8 uStack_58;
  void *local_50;
  undefined2 local_44;
  
  local_158._8_8_ = 0;
  local_158._16_8_ = local_158._16_8_ & 0xffffffffffffff00;
  local_158._0_8_ = local_158 + 0x10;
  ZmqContextManager::getContextPointer((ZmqContextManager *)local_90,(string *)local_158);
  if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
    operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
  }
  zmq::socket_t::socket_t(&local_168,*(context_t **)(local_90._0_8_ + 0x20),7);
  local_158._0_4_ = 200;
  zmq::detail::socket_base::setsockopt
            (&local_168.super_socket_base,0x11,(int)local_158,4,in_R8,(socklen_t)in_R9);
  zmq::socket_t::socket_t(&local_a0,*(context_t **)(local_90._0_8_ + 0x20),0);
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"inproc://","");
  pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_1d8,
                     (this->super_NetworkCommsInterface).super_CommsInterface.name._M_dataplus._M_p,
                     (this->super_NetworkCommsInterface).super_CommsInterface.name._M_string_length)
  ;
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar7->_M_dataplus)._M_p;
  paVar12 = &pbVar7->field_2;
  if (paVar13 == paVar12) {
    local_238.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_238.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_238.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_238._M_dataplus._M_p = (pointer)paVar13;
  }
  local_238._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pvVar22 = (void *)0x5f;
  pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_replace_aux(&local_238,local_238._M_string_length,0,1,'_');
  local_218[0]._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
  paVar13 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218[0]._M_dataplus._M_p == paVar13) {
    local_218[0].field_2._0_8_ = paVar13->_M_allocated_capacity;
    local_218[0].field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    local_218[0]._M_dataplus._M_p = (pointer)&local_218[0].field_2;
  }
  else {
    local_218[0].field_2._0_8_ = paVar13->_M_allocated_capacity;
  }
  local_218[0]._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar13;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(local_218,
                     (this->super_NetworkCommsInterface).super_CommsInterface.randomID._M_dataplus.
                     _M_p,(this->super_NetworkCommsInterface).super_CommsInterface.randomID.
                          _M_string_length);
  local_158._0_8_ = local_158 + 0x10;
  pcVar20 = (pbVar7->_M_dataplus)._M_p;
  paVar13 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar20 == paVar13) {
    local_158._16_8_ = paVar13->_M_allocated_capacity;
    local_158._24_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_158._16_8_ = paVar13->_M_allocated_capacity;
    local_158._0_8_ = pcVar20;
  }
  local_158._8_8_ = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar13;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                  "_control");
  local_90._32_8_ = &local_60;
  pcVar18 = (context_t *)(pbVar7->_M_dataplus)._M_p;
  paVar13 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar18 == paVar13) {
    local_60.ptr = (void *)paVar13->_M_allocated_capacity;
    uStack_58 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_60.ptr = (void *)paVar13->_M_allocated_capacity;
    local_90._32_8_ = pcVar18;
  }
  __addr = (sockaddr *)pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar13;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  local_90._40_8_ = __addr;
  if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
    operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
    __addr = extraout_RDX;
  }
  sVar11 = (socklen_t)paVar13;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218[0]._M_dataplus._M_p != &local_218[0].field_2) {
    operator_delete(local_218[0]._M_dataplus._M_p,
                    (ulong)(local_218[0].field_2._M_allocated_capacity + 1));
    __addr = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,(ulong)(local_238.field_2._M_allocated_capacity + 1))
    ;
    __addr = extraout_RDX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    __addr = extraout_RDX_02;
  }
  zmq::detail::socket_base::bind(&local_a0.super_socket_base,(int)local_90._32_8_,__addr,sVar11);
  local_158._0_4_ = 200;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x4;
  zmq::detail::socket_base::setsockopt
            (&local_a0.super_socket_base,0x11,(int)local_158,4,pvVar22,(socklen_t)in_R9);
  zmq::socket_t::socket_t(&local_1b8,*(context_t **)(local_90._0_8_ + 0x20),4);
  if ((this->super_NetworkCommsInterface).super_CommsInterface.serverMode == true) {
    local_158._0_4_ = 500;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x4;
    zmq::detail::socket_base::setsockopt
              (&local_1b8.super_socket_base,0x11,(int)local_158,4,pvVar22,(socklen_t)in_R9);
  }
  if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i == -1) {
    do {
      zmq_msg_init(local_218);
      pbVar7 = local_218;
      zmq::detail::socket_base::recv
                (&local_a0.super_socket_base,(int)local_218,(void *)0x0,(size_t)paVar13,(int)pvVar22
                );
      status = (ConnectionStatus)pbVar7;
      uVar8 = zmq_msg_size(local_218);
      bVar3 = false;
      if (9 < uVar8) {
        data = (void *)zmq_msg_data(local_218);
        size = zmq_msg_size(local_218);
        ActionMessage::ActionMessage((ActionMessage *)local_158,data,size);
        status = (ConnectionStatus)data;
        bVar3 = false;
        if (((local_158._0_4_ == cmd_protocol_priority) || (local_158._0_4_ == cmd_protocol_big)) ||
           (local_158._0_4_ == cmd_protocol)) {
          status = TERMINATED;
          CVar2 = TERMINATED;
          if ((int)local_158._4_4_ < 0xa3f) {
            if (local_158._4_4_ == 0x5ab) {
              pAVar16 = (ActionMessage *)local_158;
              NetworkCommsInterface::loadPortDefinitions
                        (&this->super_NetworkCommsInterface,(ActionMessage *)local_158);
              status = (ConnectionStatus)pAVar16;
              bVar3 = false;
            }
            else if (local_158._4_4_ == 0x9db) goto LAB_0027062f;
          }
          else {
            if (local_158._4_4_ != 0xa3f) {
              if (local_158._4_4_ != 0xaa6) {
                if (local_158._4_4_ == 0x16570bf) goto LAB_0027062f;
                goto LAB_00270644;
              }
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1a0,"broker name ","");
              pbVar7 = CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                 (&local_1a0,
                                  (this->super_NetworkCommsInterface).super_CommsInterface.
                                  brokerName._M_dataplus._M_p,
                                  (this->super_NetworkCommsInterface).super_CommsInterface.
                                  brokerName._M_string_length);
              local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
              paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(pbVar7->_M_dataplus)._M_p;
              paVar12 = &pbVar7->field_2;
              if (paVar13 == paVar12) {
                local_1d8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_1d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
              }
              else {
                local_1d8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_1d8._M_dataplus._M_p = (pointer)paVar13;
              }
              local_1d8._M_string_length = pbVar7->_M_string_length;
              (pbVar7->_M_dataplus)._M_p = (pointer)paVar12;
              pbVar7->_M_string_length = 0;
              (pbVar7->field_2)._M_local_buf[0] = '\0';
              pbVar7 = CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_1d8," does not match broker connection");
              local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
              paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(pbVar7->_M_dataplus)._M_p;
              paVar13 = &pbVar7->field_2;
              if (paVar12 == paVar13) {
                local_238.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                local_238.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
              }
              else {
                local_238.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                local_238._M_dataplus._M_p = (pointer)paVar12;
              }
              local_238._M_string_length = pbVar7->_M_string_length;
              (pbVar7->_M_dataplus)._M_p = (pointer)paVar13;
              pbVar7->_M_string_length = 0;
              (pbVar7->field_2)._M_local_buf[0] = '\0';
              message._M_str = local_238._M_dataplus._M_p;
              message._M_len = local_238._M_string_length;
              CommsInterface::logError((CommsInterface *)this,message);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p != &local_238.field_2) {
                operator_delete(local_238._M_dataplus._M_p,
                                (ulong)(local_238.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                operator_delete(local_1d8._M_dataplus._M_p,
                                local_1d8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
            }
            CVar2 = ERRORED;
LAB_0027062f:
            status = CVar2;
            LOCK();
            (this->super_NetworkCommsInterface).super_CommsInterface.disconnecting._M_base._M_i =
                 true;
            UNLOCK();
            CommsInterface::setRxStatus((CommsInterface *)this,status);
            bVar3 = true;
          }
        }
LAB_00270644:
        ActionMessage::~ActionMessage((ActionMessage *)local_158);
      }
      zmq_msg_close(local_218);
      if (bVar3) goto LAB_0027113e;
    } while ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i == -1);
  }
  if ((this->super_NetworkCommsInterface).super_CommsInterface.serverMode == true) {
    psVar17 = &(this->super_NetworkCommsInterface).super_CommsInterface.localTargetAddress;
    pvVar22 = (void *)0xc8;
    local_180 = psVar17;
    bVar3 = bindzmqSocket(&local_1b8,psVar17,
                          (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>.
                          _M_i + 1,(milliseconds)
                                   (this->super_NetworkCommsInterface).super_CommsInterface.
                                   connectionTimeout.__r,(milliseconds)0xc8);
    iVar4 = (int)psVar17;
    if (!bVar3) {
      if ((this->super_NetworkCommsInterface).forceConnection != true) {
        zmq::socket_t::close(&local_168,iVar4);
        zmq::socket_t::close(&local_1b8,iVar4);
        LOCK();
        (this->super_NetworkCommsInterface).super_CommsInterface.disconnecting._M_base._M_i = true;
        UNLOCK();
        paVar13 = &local_218[0].field_2;
        local_218[0]._M_dataplus._M_p = (pointer)paVar13;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_218,"Unable to bind zmq reply socket giving up ","");
        gmlc::networking::makePortAddress
                  ((string *)&local_238,local_180,
                   (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i + 1)
        ;
        uVar23 = (pointer)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218[0]._M_dataplus._M_p != paVar13) {
          uVar23 = local_218[0].field_2._M_allocated_capacity;
        }
        if ((ulong)uVar23 < (pointer)(local_218[0]._M_string_length + local_238._M_string_length)) {
          uVar23 = (pointer)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            uVar23 = local_238.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar23 < (pointer)(local_218[0]._M_string_length + local_238._M_string_length))
          goto LAB_0027086c;
          pbVar7 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                             (&local_238,0,0,local_218[0]._M_dataplus._M_p,
                              local_218[0]._M_string_length);
        }
        else {
LAB_0027086c:
          pbVar7 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                             (local_218,local_238._M_dataplus._M_p,local_238._M_string_length);
        }
        local_158._0_8_ = local_158 + 0x10;
        pcVar20 = (pbVar7->_M_dataplus)._M_p;
        paVar12 = &pbVar7->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar20 == paVar12) {
          local_158._16_8_ = paVar12->_M_allocated_capacity;
          local_158._24_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
        }
        else {
          local_158._16_8_ = paVar12->_M_allocated_capacity;
          local_158._0_8_ = pcVar20;
        }
        local_158._8_8_ = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar12;
        pbVar7->_M_string_length = 0;
        paVar12->_M_local_buf[0] = '\0';
        message_02._M_str = (char *)local_158._0_8_;
        message_02._M_len = local_158._8_8_;
        CommsInterface::logError((CommsInterface *)this,message_02);
        if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
          operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,
                          (ulong)(local_238.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218[0]._M_dataplus._M_p != paVar13) {
          operator_delete(local_218[0]._M_dataplus._M_p,
                          (ulong)(local_218[0].field_2._M_allocated_capacity + 1));
        }
        status = ERRORED;
        CommsInterface::setRxStatus((CommsInterface *)this,ERRORED);
        goto LAB_0027113e;
      }
      message_00._M_str = "attempting to override existing broker and force network connection";
      message_00._M_len = 0x43;
      CommsInterface::logWarning((CommsInterface *)this,message_00);
      zmq::socket_t::socket_t(&local_178,*(context_t **)(local_90._0_8_ + 0x20),3);
      local_158._0_4_ = 0x32;
      sVar11 = 4;
      iVar4 = 0x11;
      zmq::detail::socket_base::setsockopt
                (&local_178.super_socket_base,0x11,(int)local_158,4,pvVar22,(socklen_t)in_R9);
      zmq::socket_t::close(&local_1b8,iVar4);
      gmlc::networking::makePortAddress
                ((string *)local_158,local_180,
                 (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i + 1);
      zmq::detail::socket_base::connect
                (&local_178.super_socket_base,(int)local_158._0_8_,__addr_00,sVar11);
      if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      }
      ActionMessage::ActionMessage((ActionMessage *)local_158,cmd_global_error);
      local_158._4_4_ = 0x8f;
      SmallBuffer::operator=(&local_118,(char (*) [33])"force termination for new broker");
      if ((this->super_NetworkCommsInterface).super_CommsInterface.useJsonSerialization == true) {
        ActionMessage::to_json_string_abi_cxx11_(&local_238,(ActionMessage *)local_158);
      }
      else {
        ActionMessage::to_string_abi_cxx11_(&local_238,(ActionMessage *)local_158);
      }
      __n = 0;
      iVar4 = zmq_send(local_178.super_socket_base._handle,local_238._M_dataplus._M_p,
                       local_238._M_string_length);
      if ((iVar4 < 0) && (iVar4 = zmq_errno(), iVar4 != 0xb)) {
        peVar10 = (error_t *)__cxa_allocate_exception(0x10);
        zmq::error_t::error_t(peVar10);
        __cxa_throw(peVar10,&zmq::error_t::typeinfo,std::exception::~exception);
      }
      local_50 = local_178.super_socket_base._handle;
      local_44 = 1;
      iVar5 = 1;
      iVar4 = zmq_poll(&local_50,1,
                       (this->super_NetworkCommsInterface).super_CommsInterface.connectionTimeout.
                       __r);
      if (iVar4 < 0) {
        peVar10 = (error_t *)__cxa_allocate_exception(0x10);
        zmq::error_t::error_t(peVar10);
        __cxa_throw(peVar10,&zmq::error_t::typeinfo,std::exception::~exception);
      }
      if (iVar4 == 0) {
        zmq::socket_t::close(&local_178,iVar5);
      }
      else {
        zmq_msg_init(local_218);
        iVar4 = (int)local_218;
        zmq::detail::socket_base::recv
                  (&local_178.super_socket_base,iVar4,(void *)0x0,__n,(int)pvVar22);
        zmq::socket_t::close(&local_178,iVar4);
        local_90._16_8_ = 1;
        local_90._24_8_ = 50000000;
        do {
          iVar4 = nanosleep((timespec *)(local_90 + 0x10),(timespec *)(local_90 + 0x10));
          if (iVar4 != -1) break;
          piVar9 = __errno_location();
        } while (*piVar9 == 4);
        zmq_msg_close(local_218);
      }
      __requested_time = (timespec *)(local_90 + 0x10);
      uVar6 = 0;
      do {
        pcVar18 = *(context_t **)(local_90._0_8_ + 0x20);
        zmq::socket_t::socket_t((socket_t *)local_218,pcVar18,4);
        sVar14._handle = local_1b8.super_socket_base._handle;
        local_1b8.super_socket_base._handle = local_218[0]._M_dataplus._M_p;
        local_218[0]._M_dataplus._M_p = (pointer)sVar14._handle;
        zmq::socket_t::close((socket_t *)local_218,(int)pcVar18);
        if ((this->super_NetworkCommsInterface).super_CommsInterface.serverMode == true) {
          local_218[0]._M_dataplus._M_p._0_4_ = 500;
          zmq::detail::socket_base::setsockopt
                    (&local_1b8.super_socket_base,0x11,(int)local_218,4,pvVar22,(socklen_t)in_R9);
        }
        local_90._16_8_ = 0;
        local_90._24_8_ = 100000000;
        do {
          iVar4 = nanosleep(__requested_time,__requested_time);
          if (iVar4 != -1) break;
          piVar9 = __errno_location();
        } while (*piVar9 == 4);
        pvVar22 = (void *)0xc8;
        psVar17 = local_180;
        bVar3 = bindzmqSocket(&local_1b8,local_180,
                              (this->super_NetworkCommsInterface).PortNumber.
                              super___atomic_base<int>._M_i + 1,
                              (milliseconds)
                              (this->super_NetworkCommsInterface).super_CommsInterface.
                              connectionTimeout.__r,(milliseconds)0xc8);
        iVar4 = (int)psVar17;
        if (bVar3) break;
        zmq::socket_t::close(&local_1b8,iVar4);
        if (8 < uVar6) {
          zmq::socket_t::close(&local_168,iVar4);
          zmq::socket_t::close(&local_1b8,iVar4);
          LOCK();
          (this->super_NetworkCommsInterface).super_CommsInterface.disconnecting._M_base._M_i = true
          ;
          UNLOCK();
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1d8,"Unable to bind zmq reply even after force termination ",
                     "");
          gmlc::networking::makePortAddress
                    ((string *)&local_1a0,local_180,
                     (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i +
                     1);
          uVar23 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            uVar23 = local_1d8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar23 < local_1a0._M_string_length + local_1d8._M_string_length) {
            uVar23 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              uVar23 = local_1a0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar23 < local_1a0._M_string_length + local_1d8._M_string_length)
            goto LAB_00270f4e;
            pbVar7 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                               (&local_1a0,0,0,local_1d8._M_dataplus._M_p,local_1d8._M_string_length
                               );
          }
          else {
LAB_00270f4e:
            pbVar7 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                               (&local_1d8,local_1a0._M_dataplus._M_p,local_1a0._M_string_length);
          }
          local_218[0]._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
          paVar13 = &pbVar7->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218[0]._M_dataplus._M_p == paVar13) {
            local_218[0].field_2._0_8_ = paVar13->_M_allocated_capacity;
            local_218[0].field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
            local_218[0]._M_dataplus._M_p = (pointer)&local_218[0].field_2;
          }
          else {
            local_218[0].field_2._0_8_ = paVar13->_M_allocated_capacity;
          }
          local_218[0]._M_string_length = pbVar7->_M_string_length;
          (pbVar7->_M_dataplus)._M_p = (pointer)paVar13;
          pbVar7->_M_string_length = 0;
          paVar13->_M_local_buf[0] = '\0';
          message_03._M_str = local_218[0]._M_dataplus._M_p;
          message_03._M_len = local_218[0]._M_string_length;
          CommsInterface::logError((CommsInterface *)this,message_03);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218[0]._M_dataplus._M_p != &local_218[0].field_2) {
            operator_delete(local_218[0]._M_dataplus._M_p,
                            (ulong)(local_218[0].field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
            operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          status = ERRORED;
          CommsInterface::setRxStatus((CommsInterface *)this,ERRORED);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            pcVar20 = (pointer)(local_238.field_2._M_allocated_capacity + 1);
            operator_delete(local_238._M_dataplus._M_p,(ulong)pcVar20);
            status = (ConnectionStatus)pcVar20;
          }
          ActionMessage::~ActionMessage((ActionMessage *)local_158);
          zmq::socket_t::close(&local_178,status);
          goto LAB_0027113e;
        }
        uVar8 = (this->super_NetworkCommsInterface).super_CommsInterface.connectionTimeout.__r;
        if (0 < (long)uVar8) {
          local_90._16_8_ = uVar8 / 1000;
          local_90._24_8_ = (uVar8 % 1000) * 1000000;
          do {
            ptVar19 = __requested_time;
            iVar5 = nanosleep(__requested_time,__requested_time);
            iVar4 = (int)ptVar19;
            if (iVar5 != -1) break;
            piVar9 = __errno_location();
          } while (*piVar9 == 4);
        }
        uVar6 = uVar6 + 1;
      } while (!bVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        pcVar20 = (pointer)(local_238.field_2._M_allocated_capacity + 1);
        operator_delete(local_238._M_dataplus._M_p,(ulong)pcVar20);
        iVar4 = (int)pcVar20;
      }
      ActionMessage::~ActionMessage((ActionMessage *)local_158);
      zmq::socket_t::close(&local_178,iVar4);
    }
  }
  psVar17 = &(this->super_NetworkCommsInterface).super_CommsInterface.localTargetAddress;
  uVar23 = 200;
  psVar21 = psVar17;
  bVar3 = bindzmqSocket(&local_168,psVar17,
                        (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i
                        ,(milliseconds)
                         (this->super_NetworkCommsInterface).super_CommsInterface.connectionTimeout.
                         __r,(milliseconds)0xc8);
  iVar4 = (int)psVar21;
  if (bVar3) {
    local_218[0]._M_dataplus._M_p = (pointer)0x0;
    local_218[0]._M_string_length = 0;
    local_218[0].field_2._M_allocated_capacity = 0;
    local_218[0]._M_dataplus._M_p = (pointer)operator_new(0x30);
    local_218[0]._M_string_length = (size_type)(local_218[0]._M_dataplus._M_p + 0x30);
    *(size_type *)local_218[0]._M_dataplus._M_p = 0;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218[0]._M_dataplus._M_p + 8) = '\0';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218[0]._M_dataplus._M_p + 9) = '\0';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218[0]._M_dataplus._M_p + 10) = '\0';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218[0]._M_dataplus._M_p + 0xb) = '\0';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218[0]._M_dataplus._M_p + 0xc) = '\0';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218[0]._M_dataplus._M_p + 0xd) = '\0';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218[0]._M_dataplus._M_p + 0xe) = '\0';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218[0]._M_dataplus._M_p + 0xf) = '\0';
    lVar15 = 0x10;
    do {
      sVar1 = *(size_type *)(local_218[0]._M_dataplus._M_p + 8);
      *(size_type *)(local_218[0]._M_dataplus._M_p + lVar15) =
           *(size_type *)local_218[0]._M_dataplus._M_p;
      *(size_type *)((long)(local_218[0]._M_dataplus._M_p + lVar15) + 8) = sVar1;
      lVar15 = lVar15 + 0x10;
    } while (lVar15 != 0x30);
    *(void **)local_218[0]._M_dataplus._M_p = local_a0.super_socket_base._handle;
    sVar14._handle = (void *)CONCAT62((int6)((ulong)local_a0.super_socket_base._handle >> 0x10),1);
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218[0]._M_dataplus._M_p + 0xc) = '\x01';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218[0]._M_dataplus._M_p + 0xd) = '\0';
    *(void **)(local_218[0]._M_dataplus._M_p + 0x10) = local_168.super_socket_base._handle;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218[0]._M_dataplus._M_p + 0x1c) = '\x01';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218[0]._M_dataplus._M_p + 0x1d) = '\0';
    local_218[0].field_2._0_8_ = local_218[0]._M_string_length;
    if ((this->super_NetworkCommsInterface).super_CommsInterface.serverMode == true) {
      *(void **)(local_218[0]._M_dataplus._M_p + 0x20) = local_1b8.super_socket_base._handle;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218[0]._M_dataplus._M_p + 0x2c) = '\x01';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218[0]._M_dataplus._M_p + 0x2d) = '\0';
      sVar14._handle = local_1b8.super_socket_base._handle;
    }
    else {
      std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::resize
                ((vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> *)local_218,2);
    }
    CommsInterface::setRxStatus((CommsInterface *)this,CONNECTED);
    do {
      iVar4 = zmq_poll(local_218[0]._M_dataplus._M_p,
                       local_218[0]._M_string_length - (long)local_218[0]._M_dataplus._M_p >> 4,1000
                      );
      if (iVar4 < 0) {
        peVar10 = (error_t *)__cxa_allocate_exception(0x10);
        zmq::error_t::error_t(peVar10);
        __cxa_throw(peVar10,&zmq::error_t::typeinfo,std::exception::~exception);
      }
      if (iVar4 == 0) {
LAB_00270d71:
        uVar6 = 0;
        if (((this->super_NetworkCommsInterface).super_CommsInterface.requestDisconnect._M_base._M_i
            & 1U) != 0) break;
      }
      else {
        zmq_msg_init((message_t *)local_158);
        iVar4 = (int)(message_t *)local_158;
        if ((local_218[0]._M_dataplus._M_p[0xe] & 1U) == 0) {
LAB_00270d03:
          if ((local_218[0]._M_dataplus._M_p[0x1e] & 1U) != 0) {
            zmq::detail::socket_base::recv
                      (&local_168.super_socket_base,iVar4,(void *)0x0,(size_t)sVar14._handle,
                       (int)uVar23);
            iVar5 = processIncomingMessage(this,(message_t *)local_158);
            if (iVar5 < 0) goto LAB_00270d60;
          }
          uVar6 = 0;
          if (((this->super_NetworkCommsInterface).super_CommsInterface.serverMode == true) &&
             ((local_218[0]._M_dataplus._M_p[0x2e] & 1U) != 0)) {
            zmq::detail::socket_base::recv
                      (&local_1b8.super_socket_base,iVar4,(void *)0x0,(size_t)sVar14._handle,
                       (int)uVar23);
            uVar6 = replyToIncomingMessage(this,(message_t *)local_158,&local_1b8);
            uVar6 = uVar6 >> 0x1f | 6;
          }
        }
        else {
          zmq::detail::socket_base::recv
                    (&local_a0.super_socket_base,iVar4,(void *)0x0,(size_t)sVar14._handle,
                     (int)uVar23);
          iVar5 = processIncomingMessage(this,(message_t *)local_158);
          if (-1 < iVar5) goto LAB_00270d03;
LAB_00270d60:
          uVar6 = 7;
        }
        zmq_msg_close((message_t *)local_158);
        if (uVar6 == 0) goto LAB_00270d71;
      }
    } while (uVar6 != 7);
    LOCK();
    (this->super_NetworkCommsInterface).super_CommsInterface.disconnecting._M_base._M_i = true;
    UNLOCK();
    status = TERMINATED;
    CommsInterface::setRxStatus((CommsInterface *)this,TERMINATED);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218[0]._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      uVar8 = local_218[0].field_2._M_allocated_capacity - (long)local_218[0]._M_dataplus._M_p;
      operator_delete(local_218[0]._M_dataplus._M_p,uVar8);
      status = (ConnectionStatus)uVar8;
    }
    goto LAB_0027113e;
  }
  zmq::socket_t::close(&local_168,iVar4);
  zmq::socket_t::close(&local_1b8,iVar4);
  LOCK();
  (this->super_NetworkCommsInterface).super_CommsInterface.disconnecting._M_base._M_i = true;
  UNLOCK();
  paVar13 = &local_218[0].field_2;
  local_218[0]._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_218,"Unable to bind zmq pull socket giving up ","");
  gmlc::networking::makePortAddress
            ((string *)&local_238,psVar17,
             (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i);
  uVar23 = (pointer)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218[0]._M_dataplus._M_p != paVar13) {
    uVar23 = local_218[0].field_2._M_allocated_capacity;
  }
  if ((ulong)uVar23 < (pointer)(local_218[0]._M_string_length + local_238._M_string_length)) {
    uVar23 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      uVar23 = local_238.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar23 < (pointer)(local_218[0]._M_string_length + local_238._M_string_length))
    goto LAB_00270c5e;
    pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_238,0,0,local_218[0]._M_dataplus._M_p,local_218[0]._M_string_length);
  }
  else {
LAB_00270c5e:
    pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(local_218,local_238._M_dataplus._M_p,local_238._M_string_length);
  }
  local_158._0_8_ = (pbVar7->_M_dataplus)._M_p;
  paVar12 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._0_8_ == paVar12) {
    local_158._16_8_ = paVar12->_M_allocated_capacity;
    local_158._24_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    local_158._0_8_ = local_158 + 0x10;
  }
  else {
    local_158._16_8_ = paVar12->_M_allocated_capacity;
  }
  local_158._8_8_ = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar7->_M_string_length = 0;
  paVar12->_M_local_buf[0] = '\0';
  message_01._M_str = (char *)local_158._0_8_;
  message_01._M_len = local_158._8_8_;
  CommsInterface::logError((CommsInterface *)this,message_01);
  if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
    operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,(ulong)(local_238.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218[0]._M_dataplus._M_p != paVar13) {
    operator_delete(local_218[0]._M_dataplus._M_p,
                    (ulong)(local_218[0].field_2._M_allocated_capacity + 1));
  }
  status = ERRORED;
  CommsInterface::setRxStatus((CommsInterface *)this,ERRORED);
LAB_0027113e:
  zmq::socket_t::close(&local_1b8,status);
  if ((context_t *)local_90._32_8_ != &local_60) {
    uVar8 = (long)local_60.ptr + 1;
    operator_delete((void *)local_90._32_8_,uVar8);
    status = (ConnectionStatus)uVar8;
  }
  zmq::socket_t::close(&local_a0,status);
  zmq::socket_t::close(&local_168,status);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
  }
  return;
}

Assistant:

void ZmqComms::queue_rx_function()
{
    auto ctx = ZmqContextManager::getContextPointer();
    zmq::socket_t pullSocket(ctx->getBaseContext(), ZMQ_PULL);
    pullSocket.setsockopt(ZMQ_LINGER, 200);
    zmq::socket_t controlSocket(ctx->getBaseContext(), ZMQ_PAIR);
    std::string controlsockString =
        std::string("inproc://") + name + '_' + getRandomID() + "_control";
    try {
        controlSocket.bind(controlsockString.c_str());
    }
    catch (const zmq::error_t& e) {
        logError(std::string("binding error on internal comms socket:") + e.what());
        setRxStatus(ConnectionStatus::ERRORED);
        return;
    }
    controlSocket.setsockopt(ZMQ_LINGER, 200);

    zmq::socket_t repSocket(ctx->getBaseContext(), ZMQ_REP);
    if (serverMode) {
        repSocket.setsockopt(ZMQ_LINGER, 500);
    }

    while (PortNumber == -1) {
        zmq::message_t msg;
        controlSocket.recv(msg);
        if (msg.size() < 10) {
            continue;
        }
        ActionMessage M(static_cast<std::byte*>(msg.data()), msg.size());

        if (isProtocolCommand(M)) {
            if (M.messageID == PORT_DEFINITIONS) {
                loadPortDefinitions(M);
            } else if (M.messageID == NAME_NOT_FOUND) {
                logError(std::string("broker name ") + brokerName +
                         " does not match broker connection");
                disconnecting = true;
                setRxStatus(ConnectionStatus::ERRORED);
                return;
            } else if (M.messageID == DISCONNECT || M.messageID == CLOSE_RECEIVER) {
                disconnecting = true;
                setRxStatus(ConnectionStatus::TERMINATED);
                return;
            } else if (M.messageID == DISCONNECT_ERROR) {
                disconnecting = true;
                setRxStatus(ConnectionStatus::ERRORED);
                return;
            }
        }
    }
    if (serverMode) {
        auto bindsuccess =
            bindzmqSocket(repSocket, localTargetAddress, PortNumber + 1, connectionTimeout);
        if (!bindsuccess) {
            if (forceConnection) {
                logWarning("attempting to override existing broker and force network connection");
                zmq::socket_t brokerReqTerm(ctx->getBaseContext(), ZMQ_REQ);
                brokerReqTerm.setsockopt(ZMQ_LINGER, 50);
                try {
                    repSocket.close();
                    brokerReqTerm.connect(makePortAddress(localTargetAddress, PortNumber + 1));
                    ActionMessage term(CMD_GLOBAL_ERROR);
                    term.messageID = HELICS_ERROR_TERMINATED;
                    term.payload = "force termination for new broker";
                    auto str = (useJsonSerialization) ? term.to_json_string() : term.to_string();

                    brokerReqTerm.send(str);
                    zmq::pollitem_t poller;
                    poller.socket = static_cast<void*>(brokerReqTerm);
                    poller.events = ZMQ_POLLIN;
                    int rc = zmq::poll(&poller, 1, connectionTimeout);
                    if (rc != 0) {
                        zmq::message_t msg;
                        brokerReqTerm.recv(msg);

                        brokerReqTerm.close();
                        // this sleep is to exceed the linger timeout on the port
                        std::this_thread::sleep_for(std::chrono::milliseconds(1050));
                    } else {
                        brokerReqTerm.close();
                    }
                    bool notConnected = true;
                    int cnt = 0;
                    while (notConnected) {
                        ++cnt;
                        repSocket = zmq::socket_t(ctx->getBaseContext(), ZMQ_REP);
                        if (serverMode) {
                            repSocket.setsockopt(ZMQ_LINGER, 500);
                        }
                        std::this_thread::sleep_for(std::chrono::milliseconds(100));
                        bindsuccess = bindzmqSocket(repSocket,
                                                    localTargetAddress,
                                                    PortNumber + 1,
                                                    connectionTimeout);
                        if (bindsuccess) {
                            notConnected = false;
                        } else {
                            repSocket.close();
                            if (cnt >= 10) {
                                break;
                            }
                            std::this_thread::sleep_for(connectionTimeout);
                        }
                    }

                    if (!bindsuccess) {
                        pullSocket.close();
                        repSocket.close();
                        disconnecting = true;
                        logError(
                            std::string("Unable to bind zmq reply even after force termination ") +
                            makePortAddress(localTargetAddress, PortNumber + 1));
                        setRxStatus(ConnectionStatus::ERRORED);
                        return;
                    }
                }
                catch (zmq::error_t& ze) {
                    pullSocket.close();
                    repSocket.close();
                    disconnecting = true;
                    logError(
                        std::string(
                            "unable to make connection with existing server, force override failed with error ") +
                        std::string(ze.what()) + " on " +
                        makePortAddress(localTargetAddress, PortNumber + 1));
                    setRxStatus(ConnectionStatus::ERRORED);
                    return;
                }
            } else {
                pullSocket.close();
                repSocket.close();
                disconnecting = true;
                logError(std::string("Unable to bind zmq reply socket giving up ") +
                         makePortAddress(localTargetAddress, PortNumber + 1));
                setRxStatus(ConnectionStatus::ERRORED);
                return;
            }
        }
    }

    auto bindsuccess = bindzmqSocket(pullSocket, localTargetAddress, PortNumber, connectionTimeout);

    if (!bindsuccess) {
        pullSocket.close();
        repSocket.close();
        disconnecting = true;
        logError(std::string("Unable to bind zmq pull socket giving up ") +
                 makePortAddress(localTargetAddress, PortNumber));
        setRxStatus(ConnectionStatus::ERRORED);
        return;
    }

    std::vector<zmq::pollitem_t> poller(3);
    poller[0].socket = static_cast<void*>(controlSocket);
    poller[0].events = ZMQ_POLLIN;
    poller[1].socket = static_cast<void*>(pullSocket);
    poller[1].events = ZMQ_POLLIN;
    if (serverMode) {
        poller[2].socket = static_cast<void*>(repSocket);
        poller[2].events = ZMQ_POLLIN;
    } else {
        poller.resize(2);
    }
    setRxStatus(ConnectionStatus::CONNECTED);

    while (true) {
        auto rc = zmq::poll(poller, std::chrono::milliseconds(1000));
        if (rc > 0) {
            zmq::message_t msg;
            if (zmq::has_message(poller[0])) {
                controlSocket.recv(msg);

                auto status = processIncomingMessage(msg);
                if (status < 0) {
                    break;
                }
            }
            if (zmq::has_message(poller[1])) {
                pullSocket.recv(msg);
                auto status = processIncomingMessage(msg);
                if (status < 0) {
                    break;
                }
            }
            if (serverMode) {
                if (zmq::has_message(poller[2])) {
                    repSocket.recv(msg);
                    auto status = replyToIncomingMessage(msg, repSocket);
                    if (status < 0) {
                        break;
                    }
                    continue;
                }
            }
        }
        if (requestDisconnect.load(std::memory_order_acquire)) {
            break;
        }
    }
    disconnecting = true;
    setRxStatus(ConnectionStatus::TERMINATED);
}